

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O2

_Bool rtr_mgr_conf_in_sync(rtr_mgr_config *config)

{
  long lVar1;
  long *plVar2;
  tommy_list ptVar3;
  uint j;
  ulong uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&config->mutex);
  ptVar3 = (tommy_list)config->groups;
  while (ptVar3 = ptVar3->next, ptVar3 != (tommy_list)0x0) {
    bVar5 = true;
    uVar4 = 0;
    while (bVar5) {
      plVar2 = *(long **)((long)ptVar3->data + 0x20);
      if (*(uint *)(plVar2 + 1) <= uVar4) goto LAB_001060ff;
      bVar5 = *(long *)(*(long *)(*plVar2 + uVar4 * 8) + 0x10) != 0;
      uVar4 = uVar4 + 1;
    }
  }
LAB_001060ff:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
    return ptVar3 != (tommy_list)0x0;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT bool rtr_mgr_conf_in_sync(struct rtr_mgr_config *config)
{
	pthread_rwlock_rdlock(&config->mutex);
	tommy_node *node = tommy_list_head(&config->groups->list);

	while (node) {
		bool all_sync = true;
		struct rtr_mgr_group_node *group_node = node->data;

		for (unsigned int j = 0; all_sync && (j < group_node->group->sockets_len); j++) {
			if (group_node->group->sockets[j]->last_update == 0)
				all_sync = false;
		}
		if (all_sync) {
			pthread_rwlock_unlock(&config->mutex);
			return true;
		}
		node = node->next;
	}
	pthread_rwlock_unlock(&config->mutex);
	return false;
}